

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PorterCreate(void *pCtx,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  char **local_70;
  int local_64;
  char **azArg2;
  char *pcStack_50;
  int nArg2;
  char *zBase;
  void *pUserdata;
  PorterTokenizer *pRet;
  void *pvStack_30;
  int rc;
  fts5_api *pApi;
  Fts5Tokenizer **ppOut_local;
  char **ppcStack_18;
  int nArg_local;
  char **azArg_local;
  void *pCtx_local;
  
  pRet._4_4_ = 0;
  zBase = (char *)0x0;
  pcStack_50 = "unicode61";
  if (0 < nArg) {
    pcStack_50 = *azArg;
  }
  pvStack_30 = pCtx;
  pApi = (fts5_api *)ppOut;
  ppOut_local._4_4_ = nArg;
  ppcStack_18 = azArg;
  azArg_local = (char **)pCtx;
  pUserdata = sqlite3_malloc(0xa0);
  if (pUserdata == (void *)0x0) {
    pRet._4_4_ = 7;
  }
  else {
    memset(pUserdata,0,0xa0);
    pRet._4_4_ = (**(code **)((long)pvStack_30 + 0x10))(pvStack_30,pcStack_50,&zBase,pUserdata);
  }
  if (pRet._4_4_ == 0) {
    if (ppOut_local._4_4_ < 1) {
      local_64 = 0;
    }
    else {
      local_64 = ppOut_local._4_4_ + -1;
    }
    if (local_64 == 0) {
      local_70 = (char **)0x0;
    }
    else {
      local_70 = ppcStack_18 + 1;
    }
    pRet._4_4_ = (**pUserdata)(zBase,local_70,local_64,(long)pUserdata + 0x18);
  }
  if (pRet._4_4_ != 0) {
    fts5PorterDelete((Fts5Tokenizer *)pUserdata);
    pUserdata = (void *)0x0;
  }
  *(void **)pApi = pUserdata;
  return pRet._4_4_;
}

Assistant:

static int fts5PorterCreate(
  void *pCtx, 
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  fts5_api *pApi = (fts5_api*)pCtx;
  int rc = SQLITE_OK;
  PorterTokenizer *pRet;
  void *pUserdata = 0;
  const char *zBase = "unicode61";

  if( nArg>0 ){
    zBase = azArg[0];
  }

  pRet = (PorterTokenizer*)sqlite3_malloc(sizeof(PorterTokenizer));
  if( pRet ){
    memset(pRet, 0, sizeof(PorterTokenizer));
    rc = pApi->xFindTokenizer(pApi, zBase, &pUserdata, &pRet->tokenizer);
  }else{
    rc = SQLITE_NOMEM;
  }
  if( rc==SQLITE_OK ){
    int nArg2 = (nArg>0 ? nArg-1 : 0);
    const char **azArg2 = (nArg2 ? &azArg[1] : 0);
    rc = pRet->tokenizer.xCreate(pUserdata, azArg2, nArg2, &pRet->pTokenizer);
  }

  if( rc!=SQLITE_OK ){
    fts5PorterDelete((Fts5Tokenizer*)pRet);
    pRet = 0;
  }
  *ppOut = (Fts5Tokenizer*)pRet;
  return rc;
}